

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.cpp
# Opt level: O0

void __thiscall
miniros::NodeHandle::setParam
          (NodeHandle *this,string *key,vector<float,_std::allocator<float>_> *vec)

{
  NodeHandle *in_RDX;
  NodeHandle *in_RDI;
  string *in_stack_ffffffffffffff88;
  string *this_00;
  string local_48 [32];
  string local_28 [7];
  undefined1 in_stack_ffffffffffffffdf;
  string *in_stack_ffffffffffffffe0;
  
  this_00 = local_48 + 0x20;
  getMasterLink(in_RDI);
  std::__shared_ptr_access<miniros::MasterLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<miniros::MasterLink,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x47a3f6);
  resolveName(in_RDX,in_stack_ffffffffffffffe0,(bool)in_stack_ffffffffffffffdf);
  MasterLink::set((MasterLink *)this_00,in_stack_ffffffffffffff88,
                  (vector<float,_std::allocator<float>_> *)0x47a42a);
  std::__cxx11::string::~string(local_48);
  std::shared_ptr<miniros::MasterLink>::~shared_ptr((shared_ptr<miniros::MasterLink> *)0x47a440);
  return;
}

Assistant:

void NodeHandle::setParam(const std::string& key, const std::vector<float>& vec) const
{
  return getMasterLink()->set(resolveName(key), vec);
}